

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O0

void gen_spr_BookE206(CPUPPCState_conflict2 *env,uint32_t mas_mask,uint32_t *tlbncfg,uint32_t mmucfg
                     )

{
  _func_void_DisasContext_ptr_int_int_conflict1 *local_98;
  _func_void_DisasContext_ptr_int_int_conflict1 *uea_write;
  int i;
  int mas_sprn [8];
  char *mas_names [8];
  uint32_t mmucfg_local;
  uint32_t *tlbncfg_local;
  uint32_t mas_mask_local;
  CPUPPCState_conflict2 *env_local;
  
  memcpy(mas_sprn + 6,&PTR_anon_var_dwarf_8a580d_0176df50,0x40);
  mas_sprn[0] = 0x272;
  mas_sprn[1] = 0x273;
  mas_sprn[2] = 0x274;
  mas_sprn[3] = 0x275;
  mas_sprn[4] = 0x276;
  mas_sprn[5] = 0x3b0;
  for (uea_write._4_4_ = 0; uea_write._4_4_ < 8; uea_write._4_4_ = uea_write._4_4_ + 1) {
    local_98 = spr_write_generic32;
    if (((uea_write._4_4_ == 2) && ((mas_mask & 1 << ((byte)uea_write._4_4_ & 0x1f)) != 0)) &&
       ((env->insns_flags & 0x20) != 0)) {
      local_98 = spr_write_generic;
    }
    if ((mas_mask & 1 << ((byte)uea_write._4_4_ & 0x1f)) != 0) {
      _spr_register(env,mas_sprn[(long)uea_write._4_4_ + -2],mas_names[(long)uea_write._4_4_ + -1],
                    spr_noaccess,spr_noaccess,spr_read_generic,local_98,spr_read_generic,local_98,0)
      ;
    }
  }
  if (1 < env->nb_pids) {
    _spr_register(env,0x279,"PID1",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_booke_pid,
                  spr_read_generic,spr_write_booke_pid,0);
  }
  if (2 < env->nb_pids) {
    _spr_register(env,0x27a,"PID2",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_booke_pid,
                  spr_read_generic,spr_write_booke_pid,0);
  }
  _spr_register(env,0x3b3,"EPLC",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_eplc,
                spr_read_generic,spr_write_eplc,0);
  _spr_register(env,0x3b4,"EPSC",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_epsc,
                spr_read_generic,spr_write_epsc,0);
  _spr_register(env,0x3f7,"MMUCFG",spr_noaccess,spr_noaccess,spr_read_generic,spr_noaccess,
                spr_read_generic,spr_noaccess,(ulong)mmucfg);
  switch(env->nb_ways) {
  case 4:
    _spr_register(env,0x2b3,"TLB3CFG",spr_noaccess,spr_noaccess,spr_read_generic,spr_noaccess,
                  spr_read_generic,spr_noaccess,(ulong)tlbncfg[3]);
  case 3:
    _spr_register(env,0x2b2,"TLB2CFG",spr_noaccess,spr_noaccess,spr_read_generic,spr_noaccess,
                  spr_read_generic,spr_noaccess,(ulong)tlbncfg[2]);
  case 2:
    _spr_register(env,0x2b1,"TLB1CFG",spr_noaccess,spr_noaccess,spr_read_generic,spr_noaccess,
                  spr_read_generic,spr_noaccess,(ulong)tlbncfg[1]);
  case 1:
    _spr_register(env,0x2b0,"TLB0CFG",spr_noaccess,spr_noaccess,spr_read_generic,spr_noaccess,
                  spr_read_generic,spr_noaccess,(ulong)*tlbncfg);
  case 0:
  default:
    gen_spr_usprgh(env);
    return;
  }
}

Assistant:

static void gen_spr_BookE206(CPUPPCState *env, uint32_t mas_mask,
                             uint32_t *tlbncfg, uint32_t mmucfg)
{
    const char *mas_names[8] = {
        "MAS0", "MAS1", "MAS2", "MAS3", "MAS4", "MAS5", "MAS6", "MAS7",
    };
    int mas_sprn[8] = {
        SPR_BOOKE_MAS0, SPR_BOOKE_MAS1, SPR_BOOKE_MAS2, SPR_BOOKE_MAS3,
        SPR_BOOKE_MAS4, SPR_BOOKE_MAS5, SPR_BOOKE_MAS6, SPR_BOOKE_MAS7,
    };
    int i;

    /* TLB assist registers */
    /* XXX : not implemented */
    for (i = 0; i < 8; i++) {
        void (*uea_write)(DisasContext *ctx, int sprn, int gprn) =
            &spr_write_generic32;
        if (i == 2 && (mas_mask & (1 << i)) && (env->insns_flags & PPC_64B)) {
            uea_write = &spr_write_generic;
        }
        if (mas_mask & (1 << i)) {
            spr_register(env, mas_sprn[i], mas_names[i],
                         SPR_NOACCESS, SPR_NOACCESS,
                         &spr_read_generic, uea_write,
                         0x00000000);
        }
    }
    if (env->nb_pids > 1) {
        /* XXX : not implemented */
        spr_register(env, SPR_BOOKE_PID1, "PID1",
                     SPR_NOACCESS, SPR_NOACCESS,
                     &spr_read_generic, &spr_write_booke_pid,
                     0x00000000);
    }
    if (env->nb_pids > 2) {
        /* XXX : not implemented */
        spr_register(env, SPR_BOOKE_PID2, "PID2",
                     SPR_NOACCESS, SPR_NOACCESS,
                     &spr_read_generic, &spr_write_booke_pid,
                     0x00000000);
    }

    spr_register(env, SPR_BOOKE_EPLC, "EPLC",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_eplc,
                 0x00000000);
    spr_register(env, SPR_BOOKE_EPSC, "EPSC",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_epsc,
                 0x00000000);

    /* XXX : not implemented */
    spr_register(env, SPR_MMUCFG, "MMUCFG",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, SPR_NOACCESS,
                 mmucfg);
    switch (env->nb_ways) {
    case 4:
        spr_register(env, SPR_BOOKE_TLB3CFG, "TLB3CFG",
                     SPR_NOACCESS, SPR_NOACCESS,
                     &spr_read_generic, SPR_NOACCESS,
                     tlbncfg[3]);
        /* Fallthru */
    case 3:
        spr_register(env, SPR_BOOKE_TLB2CFG, "TLB2CFG",
                     SPR_NOACCESS, SPR_NOACCESS,
                     &spr_read_generic, SPR_NOACCESS,
                     tlbncfg[2]);
        /* Fallthru */
    case 2:
        spr_register(env, SPR_BOOKE_TLB1CFG, "TLB1CFG",
                     SPR_NOACCESS, SPR_NOACCESS,
                     &spr_read_generic, SPR_NOACCESS,
                     tlbncfg[1]);
        /* Fallthru */
    case 1:
        spr_register(env, SPR_BOOKE_TLB0CFG, "TLB0CFG",
                     SPR_NOACCESS, SPR_NOACCESS,
                     &spr_read_generic, SPR_NOACCESS,
                     tlbncfg[0]);
        /* Fallthru */
    case 0:
    default:
        break;
    }

    gen_spr_usprgh(env);
}